

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

bool __thiscall FSerializer::OpenReader(FSerializer *this,FCompressedBuffer *input)

{
  char *pcVar1;
  FReader *pFVar2;
  ulong length;
  
  length = (ulong)input->mSize;
  if (length != 0) {
    pcVar1 = input->mBuffer;
    if (pcVar1 == (char *)0x0) {
      return false;
    }
    if (this->w != (FWriter *)0x0) {
      return false;
    }
    if (this->r == (FReader *)0x0) {
      this->mErrors = 0;
      if (input->mMethod == 0) {
        pFVar2 = (FReader *)operator_new(0xb8);
        FReader::FReader(pFVar2,pcVar1,length);
        this->r = pFVar2;
      }
      else {
        pcVar1 = (char *)operator_new__(length);
        FCompressedBuffer::Decompress(input,pcVar1);
        pFVar2 = (FReader *)operator_new(0xb8);
        FReader::FReader(pFVar2,pcVar1,(ulong)input->mSize);
        this->r = pFVar2;
        operator_delete__(pcVar1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool FSerializer::OpenReader(FCompressedBuffer *input)
{
	if (input->mSize <= 0 || input->mBuffer == nullptr) return false;
	if (w != nullptr || r != nullptr) return false;

	mErrors = 0;
	if (input->mMethod == METHOD_STORED)
	{
		r = new FReader((char*)input->mBuffer, input->mSize);
	}
	else
	{
		char *unpacked = new char[input->mSize];
		input->Decompress(unpacked);
		r = new FReader(unpacked, input->mSize);
		delete[] unpacked;
	}
	return true;
}